

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CoverCreate(Vec_Str_t *vCover,Min_Cube_t *pCover,char Type)

{
  uint uVar1;
  int iVar2;
  size_t __size;
  char *pcVar3;
  
  if (pCover != (Min_Cube_t *)0x0) {
    vCover->nSize = 0;
    do {
      Min_CubeCreate(vCover,pCover,Type);
      pCover = pCover->pNext;
    } while (pCover != (Min_Cube_t *)0x0);
    uVar1 = vCover->nSize;
    if (uVar1 == vCover->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vCover->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(vCover->pArray,0x10);
        }
        vCover->pArray = pcVar3;
        vCover->nCap = 0x10;
      }
      else {
        __size = (ulong)uVar1 * 2;
        if (vCover->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(__size);
        }
        else {
          pcVar3 = (char *)realloc(vCover->pArray,__size);
        }
        vCover->pArray = pcVar3;
        vCover->nCap = (int)__size;
      }
    }
    else {
      pcVar3 = vCover->pArray;
    }
    iVar2 = vCover->nSize;
    vCover->nSize = iVar2 + 1;
    pcVar3[iVar2] = '\0';
    return;
  }
  __assert_fail("pCover != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                ,0x58,"void Min_CoverCreate(Vec_Str_t *, Min_Cube_t *, char)");
}

Assistant:

void Min_CoverCreate( Vec_Str_t * vCover, Min_Cube_t * pCover, char Type )
{
    Min_Cube_t * pCube;
    assert( pCover != NULL );
    Vec_StrClear( vCover );
    Min_CoverForEachCube( pCover, pCube )
        Min_CubeCreate( vCover, pCube, Type );
    Vec_StrPush( vCover, 0 );
}